

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

void RDL_getEdges_internal
               (RDL_data *data,uint bcc_index,uint urf_internal_index,uint rcf_internal_index,
               char *edges)

{
  RDL_graph *gra;
  RDL_cfam **ppRVar1;
  RDL_cfam *pRVar2;
  uint uVar3;
  char *visited;
  uint *puVar4;
  
  gra = data->bccGraphs->bcc_graphs[bcc_index];
  ppRVar1 = data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];
  visited = (char *)calloc(1,(ulong)gra->V);
  RDL_giveEdges(ppRVar1[rcf_internal_index]->r,ppRVar1[rcf_internal_index]->q,edges,gra,
                data->spiPerBCC[bcc_index],visited);
  memset(visited,0,(ulong)gra->V);
  RDL_giveEdges(ppRVar1[rcf_internal_index]->r,ppRVar1[rcf_internal_index]->p,edges,gra,
                data->spiPerBCC[bcc_index],visited);
  pRVar2 = ppRVar1[rcf_internal_index];
  uVar3 = pRVar2->q;
  if (pRVar2->x == 0xffffffff) {
    puVar4 = &pRVar2->p;
  }
  else {
    uVar3 = RDL_edgeId(gra,uVar3,pRVar2->x);
    edges[uVar3] = '\x01';
    uVar3 = ppRVar1[rcf_internal_index]->p;
    puVar4 = &ppRVar1[rcf_internal_index]->x;
  }
  uVar3 = RDL_edgeId(gra,uVar3,*puVar4);
  edges[uVar3] = '\x01';
  free(visited);
  return;
}

Assistant:

static void RDL_getEdges_internal(const RDL_data *data,
    unsigned bcc_index, unsigned urf_internal_index,
    unsigned rcf_internal_index, char* edges)
{
  const RDL_cfam **URF;
  char *visited;
  const RDL_graph* graph;

  graph = data->bccGraphs->bcc_graphs[bcc_index];

  URF = (const RDL_cfam **)data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];

  /* perform BFS on both paths and collect edges */
  visited = malloc(graph->V *  sizeof(*visited));
  memset(visited, 0, graph->V *  sizeof(*visited));

  RDL_giveEdges(URF[rcf_internal_index]->r, URF[rcf_internal_index]->q,
      edges, graph, data->spiPerBCC[bcc_index], visited);

  memset(visited, 0, graph->V *  sizeof(*visited));
  RDL_giveEdges(URF[rcf_internal_index]->r, URF[rcf_internal_index]->p,
      edges, graph, data->spiPerBCC[bcc_index], visited);

  /*
   * in contrast to the nodes, we have to add additional edges, because we're
   * looking at cycles...
   */
  if(URF[rcf_internal_index]->x < UINT_MAX) /*even cycle*/ {
    edges[RDL_edgeId(graph,URF[rcf_internal_index]->q,URF[rcf_internal_index]->x)] = 1;
    edges[RDL_edgeId(graph,URF[rcf_internal_index]->p,URF[rcf_internal_index]->x)] = 1;
  }
  else /*odd cycle*/ {
    edges[RDL_edgeId(graph,URF[rcf_internal_index]->q,URF[rcf_internal_index]->p)] = 1;
  }
  free(visited);
}